

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SrcListShiftJoinType(SrcList *p)

{
  ulong uVar1;
  u8 *puVar2;
  
  if (p != (SrcList *)0x0) {
    uVar1 = (ulong)(uint)(int)p->nSrc;
    puVar2 = &p->a[uVar1 - 1].jointype;
    for (; 1 < (int)uVar1; uVar1 = (ulong)((int)uVar1 - 1)) {
      *puVar2 = puVar2[-0x68];
      puVar2 = puVar2 + -0x68;
    }
    p->a[0].jointype = '\0';
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListShiftJoinType(SrcList *p){
  if( p ){
    int i;
    assert( p->a || p->nSrc==0 );
    for(i=p->nSrc-1; i>0; i--){
      p->a[i].jointype = p->a[i-1].jointype;
    }
    p->a[0].jointype = 0;
  }
}